

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O3

wchar_t archive_read_format_lha_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  lzh_br *br;
  huffman_conflict *hf;
  long *plVar1;
  char cVar2;
  ushort uVar3;
  int64_t *piVar4;
  long *plVar5;
  long lVar6;
  int *piVar7;
  uint64_t uVar8;
  long lVar9;
  uint16_t uVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  void *pvVar13;
  ulong uVar14;
  undefined4 *puVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  wchar_t tbl_bits;
  wchar_t tbl_bits_00;
  ulong uVar22;
  ulong uVar23;
  char *fmt;
  long lVar24;
  wchar_t wVar25;
  int iVar26;
  uint uVar27;
  int iVar29;
  ulong uVar30;
  byte bVar31;
  lzh_stream *plVar32;
  size_t len;
  int iVar33;
  uint uVar34;
  int iVar35;
  int local_e4;
  lzh_br local_b8;
  ulong local_a8;
  int *local_a0;
  huffman_conflict *local_98;
  archive_read *local_90;
  lzh_stream *local_88;
  int local_7c;
  void **local_78;
  int *local_70;
  long local_68;
  lzh_br *local_60;
  long local_58;
  long local_50;
  long local_48;
  int *local_40;
  long local_38;
  ushort *puVar28;
  
  piVar4 = (int64_t *)a->format->data;
  if (piVar4[2] != 0) {
    __archive_read_consume(a,piVar4[2]);
    piVar4[2] = 0;
  }
  if (*(char *)((long)piVar4 + 300) != '\0') {
    *offset = *piVar4;
    *size = 0;
    *buff = (void *)0x0;
    wVar11 = lha_end_of_entry(a);
    return wVar11;
  }
  plVar5 = (long *)a->format->data;
  if (*(char *)((long)piVar4 + 0x12e) == '\0') {
    if (plVar5[1] == 0) {
      *buff = (void *)0x0;
      *size = 0;
      *offset = *plVar5;
      *(undefined1 *)((long)plVar5 + 300) = 1;
      return L'\0';
    }
    pvVar13 = __archive_read_ahead(a,1,(ssize_t *)&local_b8);
    *buff = pvVar13;
    if (0 < (long)local_b8.cache_buffer) {
      if (plVar5[1] < (long)local_b8.cache_buffer) {
        local_b8.cache_buffer = plVar5[1];
      }
      uVar8 = local_b8.cache_buffer;
      uVar10 = lha_crc16(*(uint16_t *)(plVar5 + 3),pvVar13,local_b8.cache_buffer);
      *(uint16_t *)(plVar5 + 3) = uVar10;
      *size = uVar8;
      lVar6 = *plVar5;
      *offset = lVar6;
      *plVar5 = lVar6 + uVar8;
      plVar1 = plVar5 + 1;
      *plVar1 = *plVar1 - uVar8;
      if (*plVar1 == 0) {
        *(undefined1 *)((long)plVar5 + 300) = 1;
      }
      plVar5[2] = uVar8;
      return L'\0';
    }
    fmt = "Truncated LHa file data";
  }
  else {
    local_78 = buff;
    if (*(char *)((long)plVar5 + 299) == '\0') {
      puVar15 = (undefined4 *)plVar5[0x34];
      if (puVar15 == (undefined4 *)0x0) {
        puVar15 = (undefined4 *)calloc(1,0x158);
        plVar5[0x34] = (long)puVar15;
        if (puVar15 != (undefined4 *)0x0) goto LAB_0014f4a4;
      }
      else {
LAB_0014f4a4:
        puVar15[0x55] = 0xffffffe7;
        if ((*(char *)((long)plVar5 + 0x29) != 'l') || (*(char *)((long)plVar5 + 0x2a) != 'h')) {
LAB_0014f4f3:
          *local_78 = (void *)0x0;
          *size = 0;
          *offset = 0;
          archive_set_error(&a->archive,0x54,"Unsupported lzh compression method -%c%c%c-",
                            (ulong)(uint)(int)*(char *)((long)plVar5 + 0x29),
                            (ulong)(uint)(int)*(char *)((long)plVar5 + 0x2a),
                            (ulong)(uint)(int)*(char *)((long)plVar5 + 0x2b));
          archive_read_format_lha_read_data_skip(a);
          return L'\xffffffec';
        }
        cVar2 = *(char *)((long)plVar5 + 0x2b);
        if (cVar2 == '5') {
          bVar31 = 0;
          iVar19 = 0xd;
LAB_0014f5bb:
          bVar16 = 0;
        }
        else {
          if (cVar2 != '7') {
            if (cVar2 != '6') goto LAB_0014f4f3;
            iVar19 = 0xf;
            bVar31 = 1;
            goto LAB_0014f5bb;
          }
          iVar19 = 0x10;
          bVar16 = 1;
          bVar31 = 0;
        }
        puVar15[0x55] = 0xffffffe2;
        *(undefined8 *)(puVar15 + 1) = 0x1ffff00020000;
        pvVar13 = *(void **)(puVar15 + 4);
        if (pvVar13 == (void *)0x0) {
          pvVar13 = malloc(0x20000);
          *(void **)(puVar15 + 4) = pvVar13;
          if (pvVar13 == (void *)0x0) goto LAB_0014f691;
        }
        uVar14 = (ulong)(uint)(1 << (sbyte)iVar19);
        memset((void *)((long)pvVar13 + (0x20000 - uVar14)),0x20,uVar14);
        puVar15[6] = 0;
        *puVar15 = 0;
        puVar15[0x4f] = iVar19 + 1;
        puVar15[0x50] = (bVar31 | bVar16) | 4;
        *(undefined8 *)(puVar15 + 0x51) = 0x500000013;
        *(undefined8 *)(puVar15 + 10) = 0;
        puVar15[0xc] = 0;
        wVar11 = lzh_huffman_init((huffman_conflict *)(puVar15 + 0xe),0x1fe,tbl_bits);
        if (wVar11 == L'\0') {
          puVar15[0x10] = 9;
          wVar11 = lzh_huffman_init((huffman_conflict *)(puVar15 + 0x2e),0x13,tbl_bits_00);
          if (wVar11 == L'\0') {
            puVar15[0x55] = 0;
            *(undefined1 *)((long)plVar5 + 299) = 1;
            *(undefined4 *)(plVar5 + 0x32) = 0;
            plVar5[0x33] = 0;
            goto LAB_0014e54e;
          }
        }
      }
LAB_0014f691:
      fmt = "Couldn\'t allocate memory for lzh decompression";
      iVar19 = 0xc;
      goto LAB_0014f6a0;
    }
LAB_0014e54e:
    pvVar13 = __archive_read_ahead(a,1,&local_38);
    plVar5[0x2e] = (long)pvVar13;
    if (0 < local_38) {
      lVar6 = plVar5[1];
      if (lVar6 < local_38) {
        local_38 = lVar6;
      }
      lVar9 = local_38;
      iVar17 = (int)local_38;
      *(int *)(plVar5 + 0x2f) = iVar17;
      plVar5[0x30] = 0;
      *(undefined4 *)(plVar5 + 0x32) = 0;
      iVar19 = ((int *)plVar5[0x34])[0x55];
      lVar24 = 0;
      if (iVar19 == 0) {
        plVar32 = (lzh_stream *)(plVar5 + 0x2e);
        local_90 = a;
        local_88 = plVar32;
        local_40 = (int *)plVar5[0x34];
LAB_0014e5f2:
        piVar7 = (int *)plVar5[0x34];
        br = (lzh_br *)(piVar7 + 10);
        if (8 < *local_40) {
          local_b8.cache_buffer = *(uint64_t *)(piVar7 + 10);
          local_b8.cache_avail = piVar7[0xc];
          local_b8._12_4_ = piVar7[0xd];
          local_a8 = *(ulong *)(piVar7 + 4);
          local_50 = *(long *)(piVar7 + 0x22);
          local_68 = *(long *)(piVar7 + 0x42);
          local_e4 = piVar7[0x4e];
          iVar19 = piVar7[8];
          uVar22 = (ulong)(uint)piVar7[7];
          uVar30 = (ulong)(uint)piVar7[6];
          local_98 = (huffman_conflict *)CONCAT44(local_98._4_4_,piVar7[2]);
          iVar26 = *piVar7;
          uVar18 = piVar7[1];
          local_a0 = (int *)(long)piVar7[0x24];
          local_48 = (long)piVar7[0x44];
          local_58 = (long)(int)uVar18;
          local_70 = (int *)(local_a8 + 1);
          local_60 = br;
          uVar14 = local_a8;
switchD_0014ed6c_default:
          do {
            lVar24 = local_58;
            switch(iVar26) {
            case 9:
              uVar30 = (ulong)(int)uVar30;
              iVar19 = local_e4;
              do {
                local_e4 = iVar19 + -1;
                if (iVar19 == 0) {
                  *piVar7 = 0;
                  *(undefined4 *)&local_60->cache_buffer = (undefined4)local_b8.cache_buffer;
                  *(undefined4 *)((long)&local_60->cache_buffer + 4) = local_b8.cache_buffer._4_4_;
                  local_60->cache_avail = local_b8.cache_avail;
                  *(undefined4 *)&local_60->field_0xc = local_b8._12_4_;
                  piVar7[0x4e] = 0;
                  piVar7[6] = (int)uVar30;
                  piVar7[7] = 0;
                  goto switchD_0014e650_caseD_9;
                }
                if (local_b8.cache_avail < (wchar_t)local_a0) {
                  wVar11 = lzh_br_fillup(plVar32,&local_b8);
                  uVar14 = local_a8;
                  if ((wVar11 != L'\0') || ((wchar_t)local_a0 <= local_b8.cache_avail))
                  goto LAB_0014ee47;
                  if (lVar9 != lVar6) {
                    iVar26 = 9;
                    local_e4 = iVar19;
                    goto LAB_0014f3b3;
                  }
                  uVar34 = (uint)cache_masks[(long)local_a0] &
                           (uint)(local_b8.cache_buffer <<
                                 ((char)local_a0 - (char)local_b8.cache_avail & 0x3fU));
                  uVar21 = piVar7[0x25];
                  iVar19 = piVar7[0xf];
                  uVar3 = *(ushort *)
                           (*(long *)(piVar7 + 0x2a) + (ulong)(uVar34 >> ((byte)uVar21 & 0x1f)) * 2)
                  ;
                  uVar27 = (uint)uVar3;
                  if (iVar19 == 0 || (int)(uint)uVar3 < iVar19) {
                    uVar22 = (ulong)uVar3;
                  }
                  else {
                    do {
                      uVar22 = 0;
                      if (((int)uVar21 < 1) || (iVar26 = uVar27 - iVar19, piVar7[0x27] <= iVar26))
                      break;
                      uVar21 = uVar21 - 1;
                      puVar28 = (ushort *)(*(long *)(piVar7 + 0x2c) + 2 + (long)iVar26 * 4);
                      if ((uVar34 >> (uVar21 & 0x1f) & 1) != 0) {
                        puVar28 = (ushort *)(*(long *)(piVar7 + 0x2c) + (long)iVar26 * 4);
                      }
                      uVar27 = (uint)*puVar28;
                      uVar22 = (ulong)uVar27;
                    } while (iVar19 <= (int)uVar27);
                  }
                  uVar21 = (uint)uVar22;
                  wVar11 = local_b8.cache_avail - (uint)*(byte *)(local_50 + uVar22);
                  local_b8.cache_avail = wVar11;
                  if (wVar11 < L'\0') goto LAB_0014f3cc;
                }
                else {
LAB_0014ee47:
                  uVar34 = (uint)cache_masks[(long)local_a0] &
                           (uint)(local_b8.cache_buffer >>
                                 ((char)local_b8.cache_avail - (char)local_a0 & 0x3fU));
                  uVar21 = piVar7[0x25];
                  iVar19 = piVar7[0xf];
                  uVar3 = *(ushort *)
                           (*(long *)(piVar7 + 0x2a) + (ulong)(uVar34 >> ((byte)uVar21 & 0x1f)) * 2)
                  ;
                  uVar27 = (uint)uVar3;
                  if (iVar19 == 0 || (int)(uint)uVar3 < iVar19) {
                    uVar22 = (ulong)uVar3;
                  }
                  else {
                    do {
                      uVar22 = 0;
                      if (((int)uVar21 < 1) || (iVar26 = uVar27 - iVar19, piVar7[0x27] <= iVar26))
                      break;
                      uVar21 = uVar21 - 1;
                      puVar28 = (ushort *)(*(long *)(piVar7 + 0x2c) + 2 + (long)iVar26 * 4);
                      if ((uVar34 >> (uVar21 & 0x1f) & 1) != 0) {
                        puVar28 = (ushort *)(*(long *)(piVar7 + 0x2c) + (long)iVar26 * 4);
                      }
                      uVar27 = (uint)*puVar28;
                      uVar22 = (ulong)uVar27;
                    } while (iVar19 <= (int)uVar27);
                  }
                  uVar21 = (uint)uVar22;
                  wVar11 = local_b8.cache_avail - (uint)*(byte *)(local_50 + uVar22);
                  local_b8.cache_avail = wVar11;
                }
                if (0xff < uVar21) goto LAB_0014ef76;
                *(char *)(uVar14 + uVar30) = (char)uVar21;
                uVar30 = uVar30 + 1;
                iVar19 = local_e4;
                if (lVar24 <= (long)uVar30) {
                  plVar5[0x31] = *(long *)(plVar5[0x34] + 0x10);
                  *(int *)(plVar5 + 0x32) = (int)lVar24;
                  plVar5[0x33] = plVar5[0x33] + lVar24;
                  iVar26 = 9;
                  iVar29 = 0;
                  goto LAB_0014f30a;
                }
              } while( true );
            case 10:
              wVar11 = local_b8.cache_avail;
              goto LAB_0014ef84;
            case 0xb:
              goto LAB_0014f126;
            case 0xc:
              goto switchD_0014ed6c_caseD_c;
            }
          } while( true );
        }
        local_98 = (huffman_conflict *)(piVar7 + 0x2e);
        local_a0 = piVar7 + 0x31;
        hf = (huffman_conflict *)(piVar7 + 0xe);
        local_70 = piVar7 + 0x11;
        iVar19 = *piVar7;
switchD_0014e650_default:
        switch(iVar19) {
        case 0:
          iVar19 = piVar7[0xc];
          if (iVar19 < 0x10) {
            wVar11 = lzh_br_fillup(plVar32,br);
            if (wVar11 != L'\0') {
              iVar19 = piVar7[0xc];
              goto LAB_0014e673;
            }
            iVar19 = 0;
            if (lVar9 != lVar6) goto LAB_0014f76d;
            if (piVar7[0xc] < 8) {
              iVar26 = piVar7[6];
              if ((long)iVar26 < 1) {
                iVar19 = 1;
              }
              else {
                plVar5[0x31] = *(long *)(plVar5[0x34] + 0x10);
                *(int *)(plVar5 + 0x32) = iVar26;
                plVar5[0x33] = plVar5[0x33] + (long)iVar26;
                piVar7[6] = 0;
              }
              goto LAB_0014f76d;
            }
          }
          else {
LAB_0014e673:
            iVar19 = iVar19 + -0x10;
            uVar14 = *(ulong *)(piVar7 + 10) >> ((byte)iVar19 & 0x3f);
            piVar7[0x4e] = (uint)uVar14 & 0xffff;
            if ((uVar14 & 0xffff) != 0) {
              piVar7[0xc] = iVar19;
              iVar26 = piVar7[0x52];
              piVar7[0x2e] = piVar7[0x51];
              piVar7[0x30] = iVar26;
              piVar7[0x53] = 0;
              goto LAB_0014e6d0;
            }
          }
          break;
        case 1:
          iVar19 = piVar7[0xc];
          iVar26 = piVar7[0x30];
LAB_0014e6d0:
          if (iVar26 <= iVar19) {
LAB_0014e703:
            wVar11 = (uint)cache_masks[iVar26] &
                     (uint)(*(ulong *)(piVar7 + 10) >> ((byte)(iVar19 - iVar26) & 0x3f));
            piVar7[0x2f] = wVar11;
            piVar7[0xc] = iVar19 - iVar26;
            goto LAB_0014e726;
          }
          wVar11 = lzh_br_fillup(plVar32,br);
          iVar19 = piVar7[0xc];
          iVar26 = piVar7[0x30];
          if (iVar26 <= iVar19 || wVar11 != L'\0') goto LAB_0014e703;
          if (lVar9 == lVar6) break;
          *piVar7 = 1;
          goto LAB_0014f75c;
        case 2:
          wVar11 = piVar7[0x2f];
LAB_0014e726:
          if (wVar11 == L'\0') {
            iVar19 = piVar7[0xc];
            iVar26 = piVar7[0x30];
            if (iVar19 < iVar26) {
              wVar11 = lzh_br_fillup(plVar32,br);
              iVar19 = piVar7[0xc];
              iVar26 = piVar7[0x30];
              if (iVar19 < iVar26 && wVar11 == L'\0') {
                if (lVar9 != lVar6) {
                  *piVar7 = 2;
                  goto LAB_0014f75c;
                }
                break;
              }
            }
            wVar11 = (uint)(br->cache_buffer >> ((char)iVar19 - (char)iVar26 & 0x3fU)) &
                     (uint)cache_masks[iVar26];
            if (wVar11 < local_98->len_size) {
              **(undefined2 **)(piVar7 + 0x4a) = (short)wVar11;
              piVar7[0x44] = 0;
              piVar7[0x45] = 0;
              *(undefined1 *)(*(long *)(piVar7 + 0x42) + (ulong)(uint)wVar11) = 0;
              piVar7[0xc] = piVar7[0xc] - piVar7[0x30];
              iVar19 = (uint)(piVar7[0x53] != 0) * 4 + 5;
              goto LAB_0014ecb6;
            }
            break;
          }
          wVar25 = local_98->len_size;
          if (wVar25 < wVar11) break;
          piVar7[0x54] = 0;
          local_a0[0x10] = 0;
          local_a0[0xc] = 0;
          local_a0[0xd] = 0;
          local_a0[0xe] = 0;
          local_a0[0xf] = 0;
          local_a0[8] = 0;
          local_a0[9] = 0;
          local_a0[10] = 0;
          local_a0[0xb] = 0;
          local_a0[4] = 0;
          local_a0[5] = 0;
          local_a0[6] = 0;
          local_a0[7] = 0;
          local_a0[0] = 0;
          local_a0[1] = 0;
          local_a0[2] = 0;
          local_a0[3] = 0;
          iVar19 = 4;
          if ((L'\x02' < wVar11) && (wVar11 = L'\0', wVar25 != piVar7[0x4f])) goto LAB_0014e838;
          goto LAB_0014ecb6;
        case 3:
          wVar11 = piVar7[0x54];
LAB_0014e838:
          wVar11 = lzh_read_pt_bitlen(plVar32,wVar11,L'\x03');
          piVar7[0x54] = wVar11;
          if (wVar11 < L'\x03') {
            if ((lVar9 != lVar6) && (L'\xffffffff' < wVar11)) {
LAB_0014f861:
              *piVar7 = 3;
              goto LAB_0014f75c;
            }
          }
          else {
            iVar19 = piVar7[0xc];
            if (iVar19 < 2) {
              wVar11 = lzh_br_fillup(plVar32,br);
              iVar19 = piVar7[0xc];
              if (iVar19 < 2 && wVar11 == L'\0') {
                if (lVar9 != lVar6) goto LAB_0014f861;
                break;
              }
            }
            uVar14 = *(ulong *)(piVar7 + 10) >> ((byte)(iVar19 + -2) & 0x3f);
            uVar18 = (uint)uVar14;
            uVar21 = uVar18 & 3;
            piVar7[0xc] = iVar19 + -2;
            if ((int)uVar21 <= piVar7[0x2f] + -3) {
              if ((uVar14 & 3) == 0) {
                wVar11 = L'\x03';
              }
              else {
                wVar11 = uVar21 + L'\x03';
                uVar14 = 0;
                do {
                  *(undefined1 *)(*(long *)(piVar7 + 0x42) + 3 + uVar14) = 0;
                  uVar14 = uVar14 + 1;
                } while ((uVar18 & 3) != uVar14);
              }
              piVar7[0x54] = wVar11;
              goto LAB_0014e8ed;
            }
          }
          break;
        case 4:
          wVar11 = piVar7[0x54];
LAB_0014e8ed:
          wVar11 = lzh_read_pt_bitlen(plVar32,wVar11,piVar7[0x2f]);
          piVar7[0x54] = wVar11;
          if (wVar11 < piVar7[0x2f]) {
            if ((lVar9 != lVar6) && (L'\xffffffff' < wVar11)) {
              *piVar7 = 4;
              goto LAB_0014f75c;
            }
          }
          else {
            wVar11 = lzh_make_huffman_table(local_98);
            if (wVar11 != L'\0') {
              iVar19 = 9;
              if (piVar7[0x53] != 0) goto LAB_0014ecb6;
              goto switchD_0014e650_caseD_5;
            }
          }
          break;
        case 5:
switchD_0014e650_caseD_5:
          iVar19 = piVar7[0xc];
          iVar26 = piVar7[0x10];
          if (iVar19 < iVar26) {
            wVar11 = lzh_br_fillup(plVar32,br);
            iVar19 = piVar7[0xc];
            iVar26 = piVar7[0x10];
            if (iVar19 < iVar26 && wVar11 == L'\0') {
              if (lVar9 != lVar6) {
                *piVar7 = 5;
                goto LAB_0014f75c;
              }
              break;
            }
          }
          wVar11 = (uint)cache_masks[iVar26] &
                   (uint)(*(ulong *)(piVar7 + 10) >> ((byte)(iVar19 - iVar26) & 0x3f));
          piVar7[0xf] = wVar11;
          piVar7[0xc] = iVar19 - iVar26;
          goto LAB_0014e98d;
        case 6:
          wVar11 = piVar7[0xf];
LAB_0014e98d:
          if (wVar11 != L'\0') {
            if (wVar11 <= hf->len_size) {
              wVar25 = L'\0';
              piVar7[0x54] = 0;
              local_70[0x10] = 0;
              local_70[0xc] = 0;
              local_70[0xd] = 0;
              local_70[0xe] = 0;
              local_70[0xf] = 0;
              local_70[8] = 0;
              local_70[9] = 0;
              local_70[10] = 0;
              local_70[0xb] = 0;
              local_70[4] = 0;
              local_70[5] = 0;
              local_70[6] = 0;
              local_70[7] = 0;
              local_70[0] = 0;
              local_70[1] = 0;
              local_70[2] = 0;
              local_70[3] = 0;
LAB_0014e9c8:
              wVar12 = wVar25;
              if (wVar25 < wVar11) {
                do {
                  iVar19 = piVar7[0xc];
                  iVar26 = piVar7[0x44];
                  if (iVar19 < iVar26) {
                    wVar11 = lzh_br_fillup(plVar32,br);
                    iVar19 = piVar7[0xc];
                    iVar26 = piVar7[0x44];
                    if (iVar26 <= iVar19 || wVar11 != L'\0') goto LAB_0014ea0e;
                    if (lVar9 == lVar6) goto LAB_0014f589;
LAB_0014f74d:
                    piVar7[0x54] = wVar12;
                    *piVar7 = 7;
                    goto LAB_0014f75c;
                  }
LAB_0014ea0e:
                  uVar21 = (uint)cache_masks[iVar26] &
                           (uint)(*(ulong *)(piVar7 + 10) >> ((char)iVar19 - (char)iVar26 & 0x3fU));
                  uVar18 = piVar7[0x45];
                  uVar3 = *(ushort *)
                           (*(long *)(piVar7 + 0x4a) + (ulong)(uVar21 >> ((byte)uVar18 & 0x1f)) * 2)
                  ;
                  uVar34 = (uint)uVar3;
                  iVar26 = piVar7[0x2f];
                  if (iVar26 != 0 && iVar26 <= (int)(uint)uVar3) {
                    do {
                      if (((int)uVar18 < 1) || (iVar33 = uVar34 - iVar26, piVar7[0x47] <= iVar33))
                      goto LAB_0014eb30;
                      uVar18 = uVar18 - 1;
                      puVar28 = (ushort *)(*(long *)(piVar7 + 0x4c) + 2 + (long)iVar33 * 4);
                      if ((uVar21 >> (uVar18 & 0x1f) & 1) != 0) {
                        puVar28 = (ushort *)(*(long *)(piVar7 + 0x4c) + (long)iVar33 * 4);
                      }
                      uVar34 = (uint)*puVar28;
                    } while (iVar26 <= (int)uVar34);
                  }
                  if (uVar34 < 3) {
                    if (uVar34 == 0) {
LAB_0014eb30:
                      piVar7[0xc] = iVar19 - (uint)**(byte **)(piVar7 + 0x42);
                      *(undefined1 *)(*(long *)(piVar7 + 0x22) + (long)wVar12) = 0;
                      goto LAB_0014eb50;
                    }
                    uVar18 = (uint)(uVar34 != 1);
                    uVar14 = (ulong)uVar18 * 5 + 4;
                    uVar22 = (ulong)uVar34;
                    uVar21 = (uint)*(byte *)(*(long *)(piVar7 + 0x42) + uVar22);
                    if (iVar19 < (int)(uVar18 * 5 +
                                       (uint)*(byte *)(*(long *)(piVar7 + 0x42) + uVar22) + 4)) {
                      local_a8 = uVar14;
                      wVar11 = lzh_br_fillup(local_88,br);
                      uVar14 = local_a8;
                      if (wVar11 == L'\0') {
                        iVar19 = piVar7[0xc];
                        bVar31 = *(byte *)(*(long *)(piVar7 + 0x42) + uVar22);
                        uVar21 = (uint)bVar31;
                        if (iVar19 < (int)((int)local_a8 + (uint)bVar31)) {
                          a = local_90;
                          if (lVar9 != lVar6) goto LAB_0014f74d;
                          goto LAB_0014f589;
                        }
                      }
                      else {
                        uVar21 = (uint)*(byte *)(*(long *)(piVar7 + 0x42) + uVar22);
                        iVar19 = piVar7[0xc];
                      }
                    }
                    plVar32 = local_88;
                    a = local_90;
                    iVar19 = (((uint)(uVar34 == 1) * 5 + -9) - uVar21) + iVar19;
                    uVar21 = (uint)cache_masks[uVar14 & 0xffffffff] &
                             (uint)(*(ulong *)(piVar7 + 10) >> ((byte)iVar19 & 0x3f));
                    uVar18 = uVar21 + 3;
                    if (uVar34 != 1) {
                      uVar18 = uVar21 + 0x14;
                    }
                    piVar7[0xc] = iVar19;
                    wVar25 = uVar18 + wVar12;
                    if (piVar7[0xf] < wVar25) goto LAB_0014f589;
                    memset((void *)((long)wVar12 + *(long *)(piVar7 + 0x22)),0,(ulong)uVar18);
                  }
                  else {
                    piVar7[0xc] = iVar19 - (uint)*(byte *)(*(long *)(piVar7 + 0x42) + (ulong)uVar34)
                    ;
                    piVar7[(ulong)(uVar34 - 2) + 0x11] = piVar7[(ulong)(uVar34 - 2) + 0x11] + 1;
                    *(char *)(*(long *)(piVar7 + 0x22) + (long)wVar12) = (char)(uVar34 - 2);
LAB_0014eb50:
                    wVar25 = wVar12 + L'\x01';
                  }
                  wVar11 = piVar7[0xf];
                  wVar12 = wVar25;
                } while (wVar25 < wVar11);
              }
              if ((wVar25 <= wVar11) && (wVar11 = lzh_make_huffman_table(hf), wVar11 != L'\0')) {
switchD_0014e650_caseD_8:
                piVar7[0x2e] = piVar7[0x4f];
                piVar7[0x30] = piVar7[0x50];
                piVar7[0x53] = 1;
                iVar19 = 1;
                goto LAB_0014ecb6;
              }
            }
            break;
          }
          iVar19 = piVar7[0xc];
          iVar26 = piVar7[0x10];
          if (iVar19 < iVar26) {
            wVar11 = lzh_br_fillup(plVar32,br);
            iVar19 = piVar7[0xc];
            iVar26 = piVar7[0x10];
            if (iVar19 < iVar26 && wVar11 == L'\0') {
              if (lVar9 == lVar6) break;
              *piVar7 = 6;
LAB_0014f75c:
              iVar19 = 0;
              goto LAB_0014f76d;
            }
          }
          wVar11 = (uint)(br->cache_buffer >> ((char)iVar19 - (char)iVar26 & 0x3fU)) &
                   (uint)cache_masks[iVar26];
          if (hf->len_size <= wVar11) break;
          **(undefined2 **)(piVar7 + 0x2a) = (short)wVar11;
          piVar7[0x24] = 0;
          piVar7[0x25] = 0;
          *(undefined1 *)(*(long *)(piVar7 + 0x22) + (ulong)(uint)wVar11) = 0;
          piVar7[0xc] = piVar7[0xc] - piVar7[0x10];
          iVar19 = 8;
LAB_0014ecb6:
          *piVar7 = iVar19;
          goto switchD_0014e650_default;
        case 7:
          wVar11 = piVar7[0xf];
          wVar25 = piVar7[0x54];
          goto LAB_0014e9c8;
        case 8:
          goto switchD_0014e650_caseD_8;
        case 9:
          goto switchD_0014e650_caseD_9;
        default:
          goto switchD_0014e650_default;
        }
LAB_0014f589:
        piVar7[0x55] = -0x19;
        iVar19 = -0x19;
        goto LAB_0014f76d;
      }
LAB_0014f78d:
      if (iVar19 != 0) {
        if (iVar19 != 1) {
          archive_set_error(&a->archive,-1,"Bad lzh data");
          return L'\xffffffe7';
        }
        *(undefined1 *)((long)plVar5 + 300) = 1;
      }
      plVar5[2] = lVar24;
      plVar5[1] = plVar5[1] - lVar24;
      len = (size_t)(int)plVar5[0x32];
      *offset = *plVar5;
      if (len != 0) {
        *size = len;
        pvVar13 = (void *)plVar5[0x31];
        *local_78 = pvVar13;
        uVar10 = lha_crc16(*(uint16_t *)(plVar5 + 3),pvVar13,len);
        *(uint16_t *)(plVar5 + 3) = uVar10;
        *plVar5 = *plVar5 + len;
        return L'\0';
      }
      *size = 0;
      *local_78 = (void *)0x0;
      if (*(char *)((long)plVar5 + 300) != '\0') {
        wVar11 = lha_end_of_entry(a);
        return wVar11;
      }
      return L'\0';
    }
    fmt = "Truncated LHa file body";
  }
  iVar19 = 0x54;
LAB_0014f6a0:
  archive_set_error(&a->archive,iVar19,fmt);
  return L'\xffffffe2';
LAB_0014ef76:
  iVar19 = uVar21 - 0xfd;
LAB_0014ef84:
  lVar24 = local_48;
  wVar25 = (wchar_t)local_48;
  cVar2 = (char)local_48;
  if (wVar11 < wVar25) {
    wVar12 = lzh_br_fillup(plVar32,&local_b8);
    wVar11 = local_b8.cache_avail;
    if ((wVar12 != L'\0') || (wVar25 <= local_b8.cache_avail)) goto LAB_0014f029;
    if (lVar9 == lVar6) {
      uVar34 = (uint)cache_masks[lVar24] &
               (uint)(local_b8.cache_buffer << (cVar2 - (char)local_b8.cache_avail & 0x3fU));
      uVar21 = piVar7[0x45];
      iVar26 = piVar7[0x2f];
      uVar3 = *(ushort *)(*(long *)(piVar7 + 0x4a) + (ulong)(uVar34 >> ((byte)uVar21 & 0x1f)) * 2);
      uVar22 = (ulong)uVar3;
      if (iVar26 != 0 && iVar26 <= (int)(uint)uVar3) {
        uVar23 = uVar22;
        do {
          uVar22 = 0;
          if (((int)uVar21 < 1) ||
             (iVar33 = (int)uVar23 - iVar26, uVar22 = 0, piVar7[0x47] <= iVar33)) break;
          uVar21 = uVar21 - 1;
          puVar28 = (ushort *)(*(long *)(piVar7 + 0x4c) + 2 + (long)iVar33 * 4);
          if ((uVar34 >> (uVar21 & 0x1f) & 1) != 0) {
            puVar28 = (ushort *)(*(long *)(piVar7 + 0x4c) + (long)iVar33 * 4);
          }
          uVar22 = (ulong)*puVar28;
          uVar23 = uVar22;
        } while (iVar26 <= (int)(uint)*puVar28);
      }
      wVar11 = local_b8.cache_avail - (uint)*(byte *)(local_68 + uVar22);
      local_b8.cache_avail = wVar11;
      if (wVar11 < L'\0') goto LAB_0014f3cc;
      goto LAB_0014f126;
    }
    piVar7[8] = iVar19;
    iVar26 = 10;
LAB_0014f3b3:
    iVar29 = (int)uVar30;
LAB_0014f30a:
    *(undefined4 *)&local_60->cache_buffer = (undefined4)local_b8.cache_buffer;
    *(undefined4 *)((long)&local_60->cache_buffer + 4) = local_b8.cache_buffer._4_4_;
    local_60->cache_avail = local_b8.cache_avail;
    *(undefined4 *)&local_60->field_0xc = local_b8._12_4_;
    piVar7[0x4e] = local_e4;
    *piVar7 = iVar26;
    piVar7[6] = iVar29;
    iVar19 = 0;
LAB_0014f357:
    if (iVar19 != 100) goto LAB_0014f76d;
    goto LAB_0014e5f2;
  }
LAB_0014f029:
  uVar34 = (uint)cache_masks[lVar24] &
           (uint)(local_b8.cache_buffer >> ((char)wVar11 - cVar2 & 0x3fU));
  uVar21 = piVar7[0x45];
  iVar26 = piVar7[0x2f];
  uVar3 = *(ushort *)(*(long *)(piVar7 + 0x4a) + (ulong)(uVar34 >> ((byte)uVar21 & 0x1f)) * 2);
  uVar22 = (ulong)uVar3;
  if (iVar26 != 0 && iVar26 <= (int)(uint)uVar3) {
    uVar23 = uVar22;
    do {
      uVar22 = 0;
      if (((int)uVar21 < 1) || (iVar33 = (int)uVar23 - iVar26, uVar22 = 0, piVar7[0x47] <= iVar33))
      break;
      uVar21 = uVar21 - 1;
      puVar28 = (ushort *)(*(long *)(piVar7 + 0x4c) + 2 + (long)iVar33 * 4);
      if ((uVar34 >> (uVar21 & 0x1f) & 1) != 0) {
        puVar28 = (ushort *)(*(long *)(piVar7 + 0x4c) + (long)iVar33 * 4);
      }
      uVar22 = (ulong)*puVar28;
      uVar23 = uVar22;
    } while (iVar26 <= (int)(uint)*puVar28);
  }
  local_b8.cache_avail = wVar11 - (uint)*(byte *)(local_68 + uVar22);
LAB_0014f126:
  uVar21 = (uint)uVar22;
  if ((int)uVar21 < 2) goto LAB_0014f1b5;
  wVar11 = uVar21 + L'\xffffffff';
  if (local_b8.cache_avail < wVar11) {
    local_7c = iVar19;
    wVar25 = lzh_br_fillup(plVar32,&local_b8);
    iVar19 = local_7c;
    if ((wVar25 == L'\0') && (local_b8.cache_avail < wVar11)) {
      if (lVar9 == lVar6) {
LAB_0014f3cc:
        piVar7[0x55] = -0x19;
        iVar19 = -0x19;
        goto LAB_0014f357;
      }
      piVar7[8] = local_7c;
      piVar7[7] = uVar21;
      iVar26 = 0xb;
      goto LAB_0014f3b3;
    }
  }
  uVar21 = ((uint)cache_masks[(uint)wVar11] &
           (uint)(local_b8.cache_buffer >> ((byte)(local_b8.cache_avail - wVar11) & 0x3f))) +
           (1 << ((byte)wVar11 & 0x1f));
  local_b8.cache_avail = local_b8.cache_avail - wVar11;
LAB_0014f1b5:
  uVar22 = (ulong)(~uVar21 + (int)uVar30 & (uint)local_98);
switchD_0014ed6c_caseD_c:
  while( true ) {
    iVar29 = (int)uVar30;
    iVar26 = (int)uVar22;
    iVar33 = iVar29;
    if (iVar29 < iVar26) {
      iVar33 = iVar26;
    }
    iVar33 = uVar18 - iVar33;
    iVar35 = iVar33;
    if (iVar19 < iVar33) {
      iVar35 = iVar19;
    }
    uVar34 = iVar35 + iVar26;
    lVar24 = (long)iVar29;
    uVar21 = iVar35 + iVar29;
    uVar30 = (ulong)uVar21;
    lVar20 = (long)iVar26;
    if (((int)uVar34 < iVar29) || ((int)uVar21 < iVar26)) {
      memcpy((void *)(lVar24 + uVar14),(void *)(lVar20 + uVar14),(long)iVar35);
      uVar14 = local_a8;
    }
    else {
      uVar23 = 0;
      if (1 < iVar35) {
        uVar23 = 0;
        do {
          *(undefined1 *)((long)local_70 + uVar23 + lVar24 + -1) =
               *(undefined1 *)((long)local_70 + uVar23 + lVar20 + -1);
          *(undefined1 *)((long)local_70 + uVar23 + lVar24) =
               *(undefined1 *)((long)local_70 + uVar23 + lVar20);
          uVar23 = uVar23 + 2;
        } while (uVar23 < iVar35 - 1);
      }
      if ((int)uVar23 < iVar35) {
        *(undefined1 *)((long)(lVar24 + uVar14) + (uVar23 & 0xffffffff)) =
             *(undefined1 *)((long)(lVar20 + uVar14) + (uVar23 & 0xffffffff));
      }
    }
    a = local_90;
    plVar32 = local_88;
    if (uVar21 == uVar18) {
      plVar5[0x31] = *(long *)(plVar5[0x34] + 0x10);
      *(uint *)(plVar5 + 0x32) = uVar18;
      plVar5[0x33] = plVar5[0x33] + local_58;
      iVar26 = 9;
      iVar29 = 0;
      if (iVar33 < iVar19) {
        piVar7[8] = iVar19 - iVar35;
        piVar7[7] = uVar34 & (uint)local_98;
        iVar26 = 0xc;
      }
      goto LAB_0014f30a;
    }
    if (iVar19 <= iVar33) break;
    iVar19 = iVar19 - iVar35;
    uVar22 = (ulong)(uVar34 & (uint)local_98);
  }
  iVar26 = 9;
  goto switchD_0014ed6c_default;
switchD_0014e650_caseD_9:
  iVar19 = 100;
  goto LAB_0014f357;
LAB_0014f76d:
  lVar24 = ((long)iVar17 - (long)(int)plVar5[0x2f]) + plVar5[0x30];
  plVar5[0x30] = lVar24;
  goto LAB_0014f78d;
}

Assistant:

static int
archive_read_format_lha_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct lha *lha = (struct lha *)(a->format->data);
	int r;

	if (lha->entry_unconsumed) {
		/* Consume as much as the decompressor actually used. */
		__archive_read_consume(a, lha->entry_unconsumed);
		lha->entry_unconsumed = 0;
	}
	if (lha->end_of_entry) {
		*offset = lha->entry_offset;
		*size = 0;
		*buff = NULL;
		return (lha_end_of_entry(a));
	}

	if (lha->entry_is_compressed)
		r =  lha_read_data_lzh(a, buff, size, offset);
	else
		/* No compression. */
		r =  lha_read_data_none(a, buff, size, offset);
	return (r);
}